

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaExporter::ColladaExporter
          (ColladaExporter *this,aiScene *pScene,IOSystem *pIOSystem,string *path,string *file)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  locale alStack_78 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  stringstream *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  locale local_38 [8];
  
  this->_vptr_ColladaExporter = (_func_int **)&PTR__ColladaExporter_009be8d8;
  local_40 = &this->mFoundSkeletonRootNodeID;
  local_60 = &(this->mFoundSkeletonRootNodeID).field_2;
  (this->mFoundSkeletonRootNodeID)._M_dataplus._M_p = (pointer)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"skeleton_root","");
  local_58 = &this->mOutput;
  std::__cxx11::stringstream::stringstream((stringstream *)local_58);
  this->mIOSystem = pIOSystem;
  local_68 = &(this->mPath).field_2;
  (this->mPath)._M_dataplus._M_p = (pointer)local_68;
  pcVar2 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mPath,pcVar2,pcVar2 + path->_M_string_length);
  local_50 = &this->mFile;
  local_70 = &(this->mFile).field_2;
  (this->mFile)._M_dataplus._M_p = (pointer)local_70;
  pcVar2 = (file->_M_dataplus)._M_p;
  local_48 = &this->mPath;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + file->_M_string_length);
  (this->startstr)._M_dataplus._M_p = (pointer)&(this->startstr).field_2;
  (this->startstr)._M_string_length = 0;
  (this->startstr).field_2._M_local_buf[0] = '\0';
  (this->endstr)._M_dataplus._M_p = (pointer)&(this->endstr).field_2;
  (this->endstr)._M_string_length = 0;
  (this->endstr).field_2._M_local_buf[0] = '\0';
  (this->materials).
  super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials).
  super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials).
  super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->textures)._M_t._M_impl.super__Rb_tree_header;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::locale::locale(alStack_78,"C");
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  std::locale::~locale(alStack_78);
  *(undefined8 *)(&this->field_0x30 + *(long *)(*(long *)&this->mOutput + -0x18)) = 8;
  this->mScene = pScene;
  this->mSceneOwned = false;
  std::__cxx11::string::_M_replace
            ((ulong)&this->endstr,0,(char *)(this->endstr)._M_string_length,0x73c8ca);
  WriteFile(this);
  return;
}

Assistant:

ColladaExporter::ColladaExporter( const aiScene* pScene, IOSystem* pIOSystem, const std::string& path, const std::string& file) 
: mIOSystem(pIOSystem)
, mPath(path)
, mFile(file) {
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    mOutput.imbue( std::locale("C") );
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    mScene = pScene;
    mSceneOwned = false;

    // set up strings
    endstr = "\n";

    // start writing the file
    WriteFile();
}